

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O1

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  unordered_map<Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>_>
  *puVar1;
  char *__s;
  BottomLevelASVkImpl *pObj;
  long lVar2;
  HIT_GROUP_BINDING_MODE BindingMode_00;
  Uint32 UVar3;
  size_t sVar4;
  long lVar5;
  IMemoryAllocator *Allocator;
  int iVar6;
  undefined4 in_register_0000000c;
  char (*Args_1) [38];
  TopLevelASBase<Diligent::EngineVkImplTraits> *Args_1_00;
  size_t sVar7;
  TopLevelASBase<Diligent::EngineVkImplTraits> *pTVar8;
  ulong uVar9;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  long lVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_false,_false>,_bool>
  pVar11;
  Uint32 InstanceOffset;
  string msg;
  char *NameCopy;
  Uint32 local_8c;
  string local_88;
  undefined4 local_64;
  Uint32 local_60;
  Uint32 local_5c;
  TopLevelASBase<Diligent::EngineVkImplTraits> *local_58;
  undefined8 local_50;
  StringPool *local_48;
  ulong local_40;
  Char *local_38;
  
  local_64 = CONCAT31(in_register_00000089,BindingMode);
  local_50 = CONCAT44(in_register_00000084,HitGroupStride);
  Args_1 = (char (*) [38])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex);
  local_60 = BaseContributionToHitGroupIndex;
  local_58 = this;
  ClearInstanceData(this);
  local_40 = (ulong)InstanceCount;
  local_5c = InstanceCount;
  if (InstanceCount == 0) {
    sVar7 = 0;
  }
  else {
    lVar2 = local_40 * 0x50;
    lVar10 = 0;
    sVar7 = 0;
    do {
      if (*(long *)((long)((pInstances->Transform).data + -1) + lVar10) == 0) {
        FormatString<char[26],char[38]>
                  (&local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pInstances[i].InstanceName != nullptr",Args_1);
        Args_1 = (char (*) [38])0x72;
        DebugAssertionFailed
                  (local_88._M_dataplus._M_p,"SetInstanceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                   ,0x72);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                                   local_88.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      __s = *(char **)((long)((pInstances->Transform).data + -1) + lVar10);
      if (__s == (char *)0x0) {
        lVar5 = 0;
      }
      else {
        sVar4 = strlen(__s);
        lVar5 = sVar4 + 1;
      }
      sVar7 = sVar7 + lVar5;
      lVar10 = lVar10 + 0x50;
    } while (lVar2 != lVar10);
  }
  Allocator = GetRawAllocator();
  local_48 = &local_58->m_StringPool;
  Args_1_00 = local_58;
  StringPool::Reserve(local_48,sVar7,Allocator);
  local_8c = local_60;
  if (local_5c != 0) {
    puVar1 = &local_58->m_Instances;
    uVar9 = 0;
    BindingMode_00 = (HIT_GROUP_BINDING_MODE)local_64;
    pTVar8 = (TopLevelASBase<Diligent::EngineVkImplTraits> *)(ulong)(HIT_GROUP_BINDING_MODE)local_64
    ;
    do {
      local_38 = StringPool::CopyString(local_48,pInstances->InstanceName);
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      local_88.field_2._M_allocated_capacity._0_4_ = 0;
      pObj = (BottomLevelASVkImpl *)pInstances->pBLAS;
      if (pObj != (BottomLevelASVkImpl *)0x0) {
        CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                  ((IBottomLevelAS *)pObj);
      }
      RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=
                ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&local_88._M_string_length,pObj);
      local_88._M_dataplus._M_p._4_4_ = (int)uVar9;
      local_88._M_dataplus._M_p._0_4_ = pInstances->ContributionToHitGroupIndex;
      Args_1_00 = pTVar8;
      CalculateHitGroupIndex((InstanceDesc *)&local_88,&local_8c,(Uint32)local_50,BindingMode_00);
      local_88.field_2._M_allocated_capacity._0_4_ = *(local_88._M_string_length + 0xc0);
      pVar11 = std::
               _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<char_const*&,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc&>
                         ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)puVar1,&local_38,&local_88);
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        Args_1_00 = (TopLevelASBase<Diligent::EngineVkImplTraits> *)0x8a;
        LogError<true,char[30]>
                  (false,"SetInstanceData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                   ,0x8a,(char (*) [30])"Instance name must be unique!");
      }
      RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release
                ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&local_88._M_string_length);
      uVar9 = uVar9 + 1;
      pInstances = pInstances + 1;
    } while (local_40 != uVar9);
  }
  sVar7 = StringPool::GetRemainingSize(local_48);
  UVar3 = local_5c;
  if (sVar7 != 0) {
    FormatString<char[26],char[43]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_StringPool.GetRemainingSize() == 0",(char (*) [43])Args_1_00)
    ;
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"SetInstanceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0x8d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT44(local_88.field_2._M_allocated_capacity._4_4_,
                               local_88.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  iVar6 = -1;
  if ((HIT_GROUP_BINDING_MODE)local_64 == HIT_GROUP_BINDING_MODE_PER_TLAS) {
    iVar6 = (Uint32)local_50 - 1;
  }
  (local_58->m_BuildInfo).HitGroupStride = (Uint32)local_50;
  (local_58->m_BuildInfo).FirstContributionToHitGroupIndex = local_60;
  (local_58->m_BuildInfo).LastContributionToHitGroupIndex = iVar6 + local_8c;
  (local_58->m_BuildInfo).BindingMode = (HIT_GROUP_BINDING_MODE)local_64;
  (local_58->m_BuildInfo).InstanceCount = UVar3;
  LOCK();
  (local_58->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
       (local_58->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return true;
}

Assistant:

bool SetInstanceData(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        try
        {
            ClearInstanceData();

            size_t StringPoolSize = 0;
            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                VERIFY_EXPR(pInstances[i].InstanceName != nullptr);
                StringPoolSize += StringPool::GetRequiredReserveSize(pInstances[i].InstanceName);
            }

            this->m_StringPool.Reserve(StringPoolSize, GetRawAllocator());

            Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

            for (Uint32 i = 0; i < InstanceCount; ++i)
            {
                const auto&  Inst     = pInstances[i];
                const char*  NameCopy = this->m_StringPool.CopyString(Inst.InstanceName);
                InstanceDesc Desc     = {};

                Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
                Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
                Desc.InstanceIndex               = i;
                CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
                Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
                bool IsUniqueName = this->m_Instances.emplace(NameCopy, Desc).second;
                if (!IsUniqueName)
                    LOG_ERROR_AND_THROW("Instance name must be unique!");
            }

            VERIFY_EXPR(this->m_StringPool.GetRemainingSize() == 0);

            InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

            this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
            this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
            this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
            this->m_BuildInfo.BindingMode                      = BindingMode;
            this->m_BuildInfo.InstanceCount                    = InstanceCount;

#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            return true;
        }
        catch (...)
        {
#ifdef DILIGENT_DEVELOPMENT
            this->m_DvpVersion.fetch_add(1);
#endif
            ClearInstanceData();
            return false;
        }
    }